

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O1

void __thiscall r_code::SysView::trace(SysView *this)

{
  pointer pAVar1;
  pointer puVar2;
  ostream *poVar3;
  Atom *atom;
  pointer this_00;
  pointer puVar4;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," code size: ",0xc);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout," reference set size: ",0x15);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"---code---",10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
  std::ostream::put(-0x38);
  std::ostream::flush();
  pAVar1 = (this->super_ImageObject).code.m_vector.
           super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (this_00 = (this->super_ImageObject).code.m_vector.
                 super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.
                 super__Vector_impl_data._M_start; this_00 != pAVar1; this_00 = this_00 + 1) {
    Atom::trace(this_00);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
    std::ostream::put(-0x38);
    std::ostream::flush();
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"---reference set---",0x13);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
  std::ostream::put(-0x38);
  std::ostream::flush();
  puVar2 = (this->super_ImageObject).references.m_vector.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar4 = (this->super_ImageObject).references.m_vector.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start; puVar4 != puVar2; puVar4 = puVar4 + 1) {
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  return;
}

Assistant:

void SysView::trace()
{
    std::cout << " code size: " << code.size() << std::endl;
    std::cout << " reference set size: " << references.size() << std::endl;
    std::cout << "---code---" << std::endl;

    for (const Atom &atom : code) {
        atom.trace();
        std::cout << std::endl;
    }

    std::cout << "---reference set---" << std::endl;

    for (uint32_t reference : references) {
        std::cout << reference << std::endl;
    }
}